

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O2

UResourceBundle * icu_63::openOlsonResource(UnicodeString *id,UResourceBundle *res,UErrorCode *ec)

{
  int32_t iVar1;
  UResType UVar2;
  UResourceBundle *resB;
  UResourceBundle *pUVar3;
  
  resB = ures_openDirect_63((char *)0x0,"zoneinfo64",ec);
  pUVar3 = ures_getByKey_63(resB,"Names",(UResourceBundle *)0x0,ec);
  iVar1 = findInStringArray(pUVar3,id,ec);
  if ((iVar1 == -1) && (*ec < U_ILLEGAL_ARGUMENT_ERROR)) {
    *ec = U_MISSING_RESOURCE_ERROR;
  }
  else {
    pUVar3 = ures_getByKey_63(resB,"Zones",pUVar3,ec);
    ures_getByIndex_63(pUVar3,iVar1,res,ec);
  }
  ures_close_63(pUVar3);
  UVar2 = ures_getType_63(res);
  if (UVar2 == RES_INT) {
    iVar1 = ures_getInt_63(res,ec);
    pUVar3 = ures_getByKey_63(resB,"Zones",(UResourceBundle *)0x0,ec);
    ures_getByIndex_63(pUVar3,iVar1,res,ec);
    ures_close_63(pUVar3);
  }
  return resB;
}

Assistant:

static UResourceBundle* openOlsonResource(const UnicodeString& id,
                                          UResourceBundle& res,
                                          UErrorCode& ec)
{
#if U_DEBUG_TZ
    char buf[128];
    id.extract(0, sizeof(buf)-1, buf, sizeof(buf), "");
#endif
    UResourceBundle *top = ures_openDirect(0, kZONEINFO, &ec);
    U_DEBUG_TZ_MSG(("pre: res sz=%d\n", ures_getSize(&res)));
    /* &res = */ getZoneByName(top, id, &res, ec);
    // Dereference if this is an alias.  Docs say result should be 1
    // but it is 0 in 2.8 (?).
    U_DEBUG_TZ_MSG(("Loading zone '%s' (%s, size %d) - %s\n", buf, ures_getKey((UResourceBundle*)&res), ures_getSize(&res), u_errorName(ec)));
    if (ures_getType(&res) == URES_INT) {
        int32_t deref = ures_getInt(&res, &ec) + 0;
        U_DEBUG_TZ_MSG(("getInt: %s - type is %d\n", u_errorName(ec), ures_getType(&res)));
        UResourceBundle *ares = ures_getByKey(top, kZONES, NULL, &ec); // dereference Zones section
        ures_getByIndex(ares, deref, &res, &ec);
        ures_close(ares);
        U_DEBUG_TZ_MSG(("alias to #%d (%s) - %s\n", deref, "??", u_errorName(ec)));
    } else {
        U_DEBUG_TZ_MSG(("not an alias - size %d\n", ures_getSize(&res)));
    }
    U_DEBUG_TZ_MSG(("%s - final status is %s\n", buf, u_errorName(ec)));
    return top;
}